

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O2

bool __thiscall GraphNode::hasPointer(GraphNode *this,int value)

{
  int iVar1;
  pointer pwVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  iterator iVar4;
  const_iterator __position;
  shared_ptr<GraphNode> pointer;
  __shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  for (__position._M_current =
            (this->m_pointers).
            super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pwVar2 = (this->m_pointers).
               super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, __position._M_current != pwVar2;
      __position._M_current = __position._M_current + 1) {
    p_Var3 = ((__position._M_current)->super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if ((p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var3->_M_use_count == 0)) {
      iVar4 = std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::
              erase(&this->m_pointers,__position);
      __position._M_current = iVar4._M_current + -1;
    }
    else {
      std::__shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,__position._M_current);
      iVar1 = (local_40._M_ptr)->m_value;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      if (iVar1 == value) break;
    }
  }
  return __position._M_current != pwVar2;
}

Assistant:

bool GraphNode::hasPointer(int value) {
    for (auto iter = m_pointers.begin(); iter != m_pointers.end(); iter++)
        if (iter->expired()) {
            iter = m_pointers.erase(iter);
            iter--;
        } else {
            auto pointer = iter->lock();
            if (pointer->getValue() == value)
                return true;
        }

    return false;
}